

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::MapFieldBase::CopyIterator
          (MapFieldBase *this,MapIterator *this_iter,MapIterator *that_iter)

{
  undefined4 uVar1;
  CppType type;
  MapIterator *that_iter_local;
  MapIterator *this_iter_local;
  MapFieldBase *this_local;
  
  (this_iter->iter_).node_ = (that_iter->iter_).node_;
  (this_iter->iter_).m_ = (that_iter->iter_).m_;
  uVar1 = *(undefined4 *)&(that_iter->iter_).field_0x14;
  (this_iter->iter_).bucket_index_ = (that_iter->iter_).bucket_index_;
  *(undefined4 *)&(this_iter->iter_).field_0x14 = uVar1;
  type = MapKey::type(&that_iter->key_);
  MapKey::SetType(&this_iter->key_,type);
  MapValueConstRef::SetType
            (&(this_iter->value_).super_MapValueConstRef,
             (that_iter->value_).super_MapValueConstRef.type_);
  SetMapIteratorValue(this,this_iter);
  return;
}

Assistant:

void MapFieldBase::CopyIterator(MapIterator* this_iter,
                                const MapIterator& that_iter) const {
  this_iter->iter_ = that_iter.iter_;
  this_iter->key_.SetType(that_iter.key_.type());
  // MapValueRef::type() fails when containing data is null. However, if
  // this_iter points to MapEnd, data can be null.
  this_iter->value_.SetType(
      static_cast<FieldDescriptor::CppType>(that_iter.value_.type_));
  SetMapIteratorValue(this_iter);
}